

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryHelper.cc
# Opt level: O0

float OpenMesh::IO::read_float(istream *_in,bool _swap)

{
  undefined4 local_18;
  byte local_11;
  u3 fc;
  bool _swap_local;
  istream *_in_local;
  
  local_11 = _swap;
  _fc = _in;
  std::istream::read((char *)_in,(long)&local_18);
  if ((local_11 & 1) != 0) {
    std::swap<unsigned_char>((uchar *)&local_18,(uchar *)((long)&local_18 + 3));
    std::swap<unsigned_char>((uchar *)((long)&local_18 + 1),(uchar *)((long)&local_18 + 2));
  }
  return local_18;
}

Assistant:

float read_float(std::istream& _in, bool _swap)
{
  union u3 { float f; unsigned char c[4]; } fc;
  _in.read((char*)fc.c, 4);
  if (_swap) {
    std::swap(fc.c[0], fc.c[3]);
    std::swap(fc.c[1], fc.c[2]);
  }
  return fc.f;
}